

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sineWaveTemporalCoding.cpp
# Opt level: O2

int main(void)

{
  time_t tVar1;
  ANN *this;
  Scalar *pSVar2;
  Dense *pDVar3;
  Parameters *param;
  Population *this_00;
  ArtificialPopulation *this_01;
  Population *this_02;
  ostream *poVar4;
  TemporalPhaseEncodingSynapse_param *param_00;
  TemporalPhaseEncodingSynapse *this_03;
  TemporalPhaseDecodingSynapse_param *param_01;
  TemporalPhaseDecodingSynapse *this_04;
  Network_param *param_02;
  int iVar5;
  MatrixXd b;
  int local_124;
  DenseStorage<double,__1,__1,__1,_0> local_120;
  DenseStorage<double,__1,__1,__1,_0> local_108;
  MatrixXd w;
  Network n;
  string local_90;
  string local_70;
  string local_50;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  this = (ANN *)operator_new(0x40);
  ANN::ANN(this);
  ANN::setInputSize(this,1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"tanh",(allocator<char> *)&n);
  iVar5 = 1;
  ANN::addLayer(this,1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  b.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data._0_4_ = iVar5;
  n.synapses.super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = iVar5;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&w,(int *)&n,(int *)&b);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&w,0,0);
  *pSVar2 = 0.1;
  local_124 = iVar5;
  n.synapses.super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = iVar5;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&b,(int *)&n,&local_124);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&b,0,0);
  *pSVar2 = 0.0;
  pDVar3 = (Dense *)ANN::getLayer(this,0);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_108,(DenseStorage<double,__1,__1,__1,_0> *)&w);
  Dense::setWeights(pDVar3,(MatrixXd *)&local_108);
  free(local_108.m_data);
  pDVar3 = (Dense *)ANN::getLayer(this,0);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_120,(DenseStorage<double,__1,__1,__1,_0> *)&b);
  Dense::setBiases(pDVar3,(MatrixXd *)&local_120);
  free(local_120.m_data);
  param = (Parameters *)operator_new(0x58);
  *(undefined8 *)(param + 0x28) = 0;
  *(undefined8 *)(param + 0x30) = 0;
  *(undefined8 *)(param + 0x18) = 0;
  *(undefined8 *)(param + 0x20) = 0;
  *(undefined8 *)(param + 8) = 0;
  *(undefined8 *)(param + 0x10) = 0;
  *(undefined8 *)(param + 0x38) = 0x3ff0000000000000;
  *(undefined8 *)(param + 0x40) = 0;
  *(undefined8 *)(param + 0x48) = 0;
  *(undefined8 *)(param + 0x50) = 0;
  *(undefined8 *)param = 0x3fb999999999999a;
  this_00 = (Population *)operator_new(0x60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"SignalGenerator",(allocator<char> *)&n);
  Population::Population(this_00,1,&local_70,param);
  std::__cxx11::string::~string((string *)&local_70);
  this_01 = (ArtificialPopulation *)operator_new(0x98);
  ArtificialPopulation::ArtificialPopulation(this_01,this);
  this_02 = (Population *)operator_new(0x60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"PassThrough",(allocator<char> *)&n);
  Population::Population(this_02,1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar4);
  param_00 = (TemporalPhaseEncodingSynapse_param *)operator_new(0x18);
  *(undefined8 *)param_00 = 0;
  param_00->som_phase = 0.0;
  param_00->window_length_s = 0.1;
  param_00->som_frequency = 800;
  this_03 = (TemporalPhaseEncodingSynapse *)operator_new(0x78);
  TemporalPhaseEncodingSynapse::TemporalPhaseEncodingSynapse(this_03,this_00,this_02,param_00);
  param_01 = (TemporalPhaseDecodingSynapse_param *)operator_new(0x20);
  *(undefined8 *)param_01 = 0;
  param_01->som_phase = 0.0;
  param_01->window_length_s = 0.1;
  param_01->delay_s = 0.0;
  param_01->som_frequency = 800;
  this_04 = (TemporalPhaseDecodingSynapse *)operator_new(0x78);
  TemporalPhaseDecodingSynapse::TemporalPhaseDecodingSynapse
            (this_04,this_02,(Population *)this_01,param_01);
  param_02 = (Network_param *)operator_new(8);
  param_02->dt = 0.001;
  Network::Network(&n,param_02);
  Network::add(&n,(Synapse *)this_03);
  Network::add(&n,(Synapse *)this_04);
  Network::run(&n,50.0);
  Network::~Network(&n);
  free((void *)CONCAT44(b.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                        .m_data._4_4_,
                        (int)b.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data));
  free(w.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return 0;
}

Assistant:

int main() 
{
    srand(time(NULL));

    ANN* ann = new ANN();
    ann->setInputSize(1);
    ann->addLayer(1, "tanh");

    Eigen::MatrixXd w = Eigen::MatrixXd(1, 1);
    w(0,0) = 0.1;
    Eigen::MatrixXd b = Eigen::MatrixXd(1, 1);
    b(0,0) = 0.0;
    static_cast<Dense*>(ann->getLayer(0))->setWeights(w);
    static_cast<Dense*>(ann->getLayer(0))->setBiases(b);

    // Populations
    SignalGenerator_param* paramp1 = new SignalGenerator_param();
    paramp1->f1 = 0.1;
    Population* p1 = new Population(1, "SignalGenerator", paramp1);

    ArtificialPopulation* p2 = new ArtificialPopulation(ann);

    Population* p3 = new Population(1, "PassThrough");
    cout << (long)p3 << endl;

    // Synapses
    TemporalPhaseEncodingSynapse_param* params1 = new TemporalPhaseEncodingSynapse_param();
    params1->window_length_s = 0.1;
    params1->som_frequency = 800;
    // params1->som_phase = M_PI / 2.0;
    TemporalPhaseEncodingSynapse* s1 = new TemporalPhaseEncodingSynapse(p1, p3, params1);

    TemporalPhaseDecodingSynapse_param* params2 = new TemporalPhaseDecodingSynapse_param();
    params2->window_length_s = 0.1;
    params2->som_frequency = 800;
    // params2->som_phase = M_PI / 2.0;
    TemporalPhaseDecodingSynapse* s2 = new TemporalPhaseDecodingSynapse(p3, p2, params2);

    // Create the network

    Network_param* n_param = new Network_param();
    n_param->dt = 0.001;
    Network n = Network(n_param);

    // Add the synapse to the network
    n.add(s1);
    n.add(s2);

    // Run the network for 100 second
    n.run(50.0);
    
    return 0;
}